

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_Flip(FlipForm4 Flip)

{
  value_type vVar1;
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  uint uVar2;
  uint32_t x;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  code *in_RDI;
  bool bVar6;
  bool bVar7;
  uint32_t yCorrection;
  uint32_t xCorrection;
  bool verticalFlip;
  bool horizontalFlip;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  uint8_t intensityFill;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_fffffffffffffcec;
  uint in_stack_fffffffffffffcf0;
  uint8_t in_stack_fffffffffffffcf6;
  uint8_t in_stack_fffffffffffffcf7;
  uint32_t in_stack_fffffffffffffcf8;
  uint32_t in_stack_fffffffffffffcfc;
  uint32_t in_stack_fffffffffffffd00;
  uint32_t in_stack_fffffffffffffd04;
  uint32_t in_stack_fffffffffffffd08;
  undefined2 in_stack_fffffffffffffd0c;
  undefined1 in_stack_fffffffffffffd0e;
  undefined1 in_stack_fffffffffffffd0f;
  Image *in_stack_fffffffffffffd10;
  uint32_t in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined8 in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  uint8_t in_stack_fffffffffffffd37;
  uint8_t uVar8;
  uint32_t in_stack_fffffffffffffd38;
  uint32_t in_stack_fffffffffffffd3c;
  value_type vVar9;
  uint32_t in_stack_fffffffffffffd40;
  value_type vVar10;
  uint32_t in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 uVar11;
  uint32_t *in_stack_fffffffffffffd50;
  uint32_t *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd68;
  size_type sVar12;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffd70;
  undefined1 **local_1a0;
  uint local_168;
  uint local_164;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_160;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_148;
  undefined1 local_129;
  undefined8 *local_d8;
  undefined1 *local_d0 [5];
  undefined1 local_a8 [40];
  undefined8 *local_80;
  undefined8 local_78;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_70;
  uint8_t local_41;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  code *local_28;
  byte local_19;
  
  local_28 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffcec);
  local_41 = Unit_Test::intensityValue();
  local_129 = 1;
  local_d8 = local_d0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),in_stack_fffffffffffffcfc
             ,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf6);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffd1c >> 0x18),in_stack_fffffffffffffd18,
             (uint32_t)((ulong)in_stack_fffffffffffffd10 >> 0x20),
             (Image *)CONCAT17(in_stack_fffffffffffffd0f,
                               CONCAT16(in_stack_fffffffffffffd0e,
                                        CONCAT24(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08
                                                ))));
  local_d8 = (undefined8 *)local_a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),in_stack_fffffffffffffcfc
             ,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf6);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffd1c >> 0x18),in_stack_fffffffffffffd18,
             (uint32_t)((ulong)in_stack_fffffffffffffd10 >> 0x20),
             (Image *)CONCAT17(in_stack_fffffffffffffd0f,
                               CONCAT16(in_stack_fffffffffffffd0e,
                                        CONCAT24(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08
                                                ))));
  local_129 = 0;
  local_80 = local_d0;
  local_78 = 2;
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1d516d);
  __l._M_len._0_7_ = in_stack_fffffffffffffd30;
  __l._M_array = (iterator)in_stack_fffffffffffffd28;
  __l._M_len._7_1_ = in_stack_fffffffffffffd37;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1d51a1);
  local_1a0 = (undefined1 **)&local_80;
  do {
    local_1a0 = local_1a0 + -5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1d51d6);
    uVar8 = (uint8_t)(in_stack_fffffffffffffcfc >> 0x18);
  } while (local_1a0 != local_d0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d5200);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d520d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d5222);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d5237);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
             ,in_stack_fffffffffffffd50);
  uVar2 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
  bVar6 = uVar2 == 0;
  uVar2 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
  bVar7 = uVar2 == 0;
  if (bVar7) {
    if (1 < local_168) {
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ::operator[](&local_70,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_148,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_160,0);
      Image_Function::Fill
                (in_stack_fffffffffffffd10,
                 CONCAT13(in_stack_fffffffffffffd0f,
                          CONCAT12(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd0c)),
                 in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffd00,uVar8
                );
    }
  }
  else if ((bVar6) && (1 < local_164)) {
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::operator[](&local_70,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_148,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_160,0);
    Image_Function::Fill
              (in_stack_fffffffffffffd10,
               CONCAT13(in_stack_fffffffffffffd0f,
                        CONCAT12(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd0c)),
               in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffd00,uVar8);
  }
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_70,0);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_148,0);
  vVar9 = *pvVar4;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_160,0);
  vVar10 = *pvVar4;
  pvVar5 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_70,1);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_148,1);
  vVar1 = *pvVar4;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_160,1);
  uVar2 = (uint)bVar7;
  (*local_28)(pvVar3,vVar9,vVar10,pvVar5,vVar1,*pvVar4,local_164,local_168,bVar6);
  if (bVar7) {
    sVar12 = 1;
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::operator[](&local_70,1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_148,sVar12);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_160,sVar12);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,0);
    bVar6 = Unit_Test::verifyImage
                      ((Image *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                       in_stack_fffffffffffffd44,in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c
                       ,in_stack_fffffffffffffd38,in_stack_fffffffffffffd37);
    if (!bVar6) {
      local_19 = 0;
      goto LAB_001d5a96;
    }
    if (1 < local_168) {
      sVar12 = 1;
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ::operator[](&local_70,1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_148,sVar12);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_160,sVar12);
      bVar6 = Unit_Test::verifyImage
                        ((Image *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                         in_stack_fffffffffffffd44,in_stack_fffffffffffffd40,
                         in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38,
                         in_stack_fffffffffffffd37);
      if (!bVar6) {
        local_19 = 0;
        goto LAB_001d5a96;
      }
    }
  }
  else {
    sVar12 = 1;
    pvVar3 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](&local_70,1);
    uVar8 = (uint8_t)((ulong)pvVar3 >> 0x38);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_148,sVar12)
    ;
    vVar9 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_160,sVar12)
    ;
    vVar10 = *pvVar4;
    x = (local_164 >> 1) + (local_164 & 1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,0);
    bVar7 = Unit_Test::verifyImage
                      ((Image *)CONCAT44(in_stack_fffffffffffffd4c,local_168),x,vVar10,vVar9,
                       in_stack_fffffffffffffd38,uVar8);
    uVar11 = CONCAT13(bVar7,(int3)in_stack_fffffffffffffd4c);
    if (!bVar7) {
      local_19 = 0;
      goto LAB_001d5a96;
    }
    if (1 < local_164) {
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ::operator[](&local_70,1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_148,1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_160,1);
      if (!bVar6) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,0);
      }
      bVar6 = Unit_Test::verifyImage
                        ((Image *)CONCAT44(uVar11,local_168),x,vVar10,vVar9,
                         in_stack_fffffffffffffd38,uVar8);
      if (!bVar6) {
        local_19 = 0;
        goto LAB_001d5a96;
      }
    }
  }
  local_19 = 1;
LAB_001d5a96:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd04,uVar2));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd04,uVar2));
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)CONCAT44(in_stack_fffffffffffffd04,uVar2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffd04,uVar2));
  return (bool)(local_19 & 1);
}

Assistant:

bool form4_Flip(FlipForm4 Flip)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const uint8_t intensityFill = intensityValue();
        std::vector < PenguinV_Image::Image > image = { uniformImage( intensity[0] ), uniformImage( intensity[1] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        const bool horizontalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const bool verticalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const uint32_t xCorrection = roiWidth % 2;
        const uint32_t yCorrection = roiHeight % 2;

        if (verticalFlip)
        {
            if (roiHeight > 1)
                Image_Function::Fill(image[0], roiX[0], roiY[0], roiWidth, roiHeight / 2, intensityFill);
        }
        else if (horizontalFlip)
        {
            if (roiWidth > 1)
                Image_Function::Fill(image[0], roiX[0], roiY[0], roiWidth / 2, roiHeight, intensityFill);
        }

        Flip( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], roiWidth, roiHeight, horizontalFlip, verticalFlip );

        if (verticalFlip) {
            if( !verifyImage( image[1], roiX[1], roiY[1], roiWidth, roiHeight / 2 + yCorrection, intensity[0] ) )
                return false;
            if((roiHeight > 1) && !verifyImage( image[1], roiX[1], roiY[1] + roiHeight / 2 + yCorrection, roiWidth, roiHeight / 2, intensityFill ) )
                return false;
        }
        else {
            if( !verifyImage( image[1], roiX[1], roiY[1], roiWidth / 2 + xCorrection, roiHeight, intensity[0] ) )
                return false;
            if( (roiWidth > 1) && !verifyImage( image[1], roiX[1] + roiWidth / 2 + xCorrection, roiY[1], roiWidth / 2, roiHeight,
                                                horizontalFlip ? intensityFill : intensity[0] ) )
                return false;
        }

        return true;
    }